

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoderTest_test_skip_bytes_in_case_type_is_unknown_Test
::PriceUpdateDecoderTest_test_skip_bytes_in_case_type_is_unknown_Test
          (PriceUpdateDecoderTest_test_skip_bytes_in_case_type_is_unknown_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_PriceUpdateDecoderTest).super_Test._vptr_Test =
       (_func_int **)&PTR__PriceUpdateDecoderTest_0029e1d0;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer
            (&(this->super_PriceUpdateDecoderTest).buffer,0x2000);
  (this->super_PriceUpdateDecoderTest).super_Test._vptr_Test =
       (_func_int **)&PTR__PriceUpdateDecoderTest_0029e070;
  return;
}

Assistant:

TEST_F(PriceUpdateDecoderTest, test_skip_bytes_in_case_type_is_unknown)
{
    std::string string = "ciao";
    unsigned char* unknown = new unsigned char[9]{1, 2, 3, 4, 5, 6, 7, 8, 9};
    double price = 9876.543;

    // STRING
    Varint::WriteString(buffer, string);
    // UNDECODABLE
    Varint::WriteU32(buffer, 9);
    buffer.WriteBytes(unknown, 9);
    // PRICE
    Varint::WriteU64(buffer, (uint64_t)(price * 1000000));

    FieldDef field_def_string = FieldDef(1, FieldTypeEnum::STRING, "field");
    FieldDef field_def_unknown = FieldDef(1, FieldTypeEnum::UNRECOGNISED, "field", FieldEncodingEnum::BYTE_ARRAY, 0);
    FieldDef field_def_price = FieldDef(1, FieldTypeEnum::DOUBLE, "field", FieldEncodingEnum::VARINT, 6);
    PriceField price_field_string = PriceUpdateDecoder::DecodeField(buffer, field_def_string);
    PriceField price_field_unknown = PriceUpdateDecoder::DecodeField(buffer, field_def_unknown);
    PriceField price_field_price = PriceUpdateDecoder::DecodeField(buffer, field_def_price);

    EXPECT_EQ(PriceField::STRING, price_field_string.GetType());
    EXPECT_EQ(string, price_field_string.GetString());
    EXPECT_EQ(PriceField::NOTHING, price_field_unknown.GetType());
    EXPECT_EQ(PriceField::DOUBLE, price_field_price.GetType());
    EXPECT_EQ(price, price_field_price.GetDouble());
}